

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::PlainGatherFloatCubeArray::Supported(PlainGatherFloatCubeArray *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                     m_context)->m_contextInfo,"GL_ARB_texture_cube_map_array");
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_texture_cube_map_array not supported",&local_39);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

virtual bool Supported()
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_cube_map_array"))
		{
			OutputNotSupported("GL_ARB_texture_cube_map_array not supported");
			return false;
		}
		return true;
	}